

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O1

void ga_sort_permutation(Integer *pn,Integer *index,Integer *base)

{
  long lVar1;
  undefined8 uVar2;
  Integer IVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  Integer *pIVar7;
  ulong uVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  
  uVar6 = *pn;
  if (1 < (long)uVar6) {
    uVar5 = uVar6 >> 1;
    lVar4 = uVar6 * 8 + -8;
    if (uVar5 != 1) {
      do {
        plVar10 = base + (uVar5 - 1);
        uVar8 = uVar5;
        for (plVar9 = base + (uVar5 - 1) + uVar5; plVar9 <= base + (uVar6 - 1);
            plVar9 = plVar9 + uVar8) {
          uVar8 = uVar8 * 2;
          if (plVar9 != base + (uVar6 - 1)) {
            plVar11 = plVar9 + 1;
            if (plVar9[1] <= *plVar9) {
              plVar11 = plVar9;
            }
            uVar8 = uVar8 | *plVar9 < plVar9[1];
            plVar9 = plVar11;
          }
          lVar1 = *plVar10;
          if (*plVar9 <= lVar1) break;
          *plVar10 = *plVar9;
          *plVar9 = lVar1;
          uVar2 = *(undefined8 *)((long)index + ((long)plVar10 - (long)base));
          *(undefined8 *)((long)index + ((long)plVar10 - (long)base)) =
               *(undefined8 *)((long)index + ((long)plVar9 - (long)base));
          *(undefined8 *)((long)index + ((long)plVar9 - (long)base)) = uVar2;
          plVar10 = plVar9;
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 1);
    }
    if (lVar4 != 0) {
      do {
        if (7 < lVar4) {
          uVar6 = 1;
          pIVar7 = base;
          plVar10 = base + 1;
          do {
            uVar6 = uVar6 * 2;
            if (plVar10 != (long *)((long)base + lVar4)) {
              plVar9 = plVar10 + 1;
              if (plVar10[1] <= *plVar10) {
                plVar9 = plVar10;
              }
              uVar6 = uVar6 | *plVar10 < plVar10[1];
              plVar10 = plVar9;
            }
            lVar1 = *pIVar7;
            if (*plVar10 <= lVar1) break;
            *pIVar7 = *plVar10;
            *plVar10 = lVar1;
            uVar2 = *(undefined8 *)((long)index + ((long)pIVar7 - (long)base));
            *(undefined8 *)((long)index + ((long)pIVar7 - (long)base)) =
                 *(undefined8 *)((long)index + ((long)plVar10 - (long)base));
            *(undefined8 *)((long)index + ((long)plVar10 - (long)base)) = uVar2;
            plVar9 = plVar10 + uVar6;
            pIVar7 = plVar10;
            plVar10 = plVar9;
          } while (plVar9 <= (long *)((long)base + lVar4));
        }
        IVar3 = *base;
        *base = *(Integer *)((long)base + lVar4);
        *(Integer *)((long)base + lVar4) = IVar3;
        IVar3 = *index;
        *index = *(Integer *)((long)index + lVar4);
        *(Integer *)((long)index + lVar4) = IVar3;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void ga_sort_permutation(pn, index, base)
     Integer *pn;
     Integer *index;
     Integer *base;
{
  if (*pn < 2) return;
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    Integer itmp;\
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    itmp=index[ia]; index[ia]=index[ib]; index[ib] = itmp;\
   }
  INDEX_SORT(base,pn,SWAP);
}